

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O3

void mp::
     WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<_1>>>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>
               *condc,ItemNamer *vnam)

{
  double value;
  Buffer<char> *pBVar1;
  char *pcVar2;
  size_t __n;
  size_t sVar3;
  ulong uVar4;
  char *str;
  ptrdiff_t _Num;
  FormatSpec local_48;
  
  pcVar2 = ItemNamer::at(vnam,(long)(condc->
                                    super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>_>
                                    ).super_FunctionalConstraint.result_var_);
  __n = strlen(pcVar2);
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  uVar4 = pBVar1->size_ + __n;
  if (pBVar1->capacity_ < uVar4) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
  }
  if (__n != 0) {
    memmove(pBVar1->ptr_ + pBVar1->size_,pcVar2,__n);
  }
  pBVar1->size_ = uVar4;
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  sVar3 = pBVar1->size_;
  uVar4 = sVar3 + 9;
  if (pBVar1->capacity_ < uVar4) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
    sVar3 = pBVar1->size_;
  }
  builtin_strncpy(pBVar1->ptr_ + sVar3,"==1 <==> ",9);
  pBVar1->size_ = uVar4;
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  sVar3 = pBVar1->size_;
  if (sVar3 == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,sVar3 + 1);
    sVar3 = pBVar1->size_;
  }
  pBVar1->size_ = sVar3 + 1;
  pBVar1->ptr_[sVar3] = '(';
  value = (condc->
          super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>_>
          ).
          super_CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>_>
          .args_.super_AlgConRhs<_1>.rhs_;
  WriteModelItem(wrt,&(condc->
                      super_CustomFunctionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>_>
                      ).
                      super_CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<_1>_>_>_>
                      .args_.super_QuadAndLinTerms,vnam);
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  sVar3 = pBVar1->size_;
  if (sVar3 == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,sVar3 + 1);
    sVar3 = pBVar1->size_;
  }
  pBVar1->size_ = sVar3 + 1;
  pBVar1->ptr_[sVar3] = ' ';
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  sVar3 = pBVar1->size_;
  uVar4 = sVar3 + 2;
  if (pBVar1->capacity_ < uVar4) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar4);
    sVar3 = pBVar1->size_;
  }
  pcVar2 = pBVar1->ptr_;
  (pcVar2 + sVar3)[0] = '<';
  (pcVar2 + sVar3)[1] = '=';
  pBVar1->size_ = uVar4;
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  sVar3 = pBVar1->size_;
  if (sVar3 == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,sVar3 + 1);
    sVar3 = pBVar1->size_;
  }
  pBVar1->size_ = sVar3 + 1;
  pBVar1->ptr_[sVar3] = ' ';
  local_48.super_AlignSpec.super_WidthSpec.width_ = 0;
  local_48.super_AlignSpec.super_WidthSpec.fill_ = L' ';
  local_48.super_AlignSpec.align_ = ALIGN_DEFAULT;
  local_48.flags_ = 0;
  local_48.precision_ = -1;
  local_48.type_ = '\0';
  fmt::BasicWriter<char>::write_double<double>(&wrt->super_BasicWriter<char>,value,&local_48);
  pBVar1 = (wrt->super_BasicWriter<char>).buffer_;
  sVar3 = pBVar1->size_;
  if (sVar3 == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,sVar3 + 1);
    sVar3 = pBVar1->size_;
  }
  pBVar1->size_ = sVar3 + 1;
  pBVar1->ptr_[sVar3] = ')';
  return;
}

Assistant:

inline void WriteModelItem(Writer& wrt,
                    const ConditionalConstraint<Con>& condc,
                    ItemNamer& vnam) {
  wrt << vnam.at(condc.GetResultVar()) << "==1 <==> ";
  wrt << '(';
  WriteModelItem(wrt, condc.GetArguments(), vnam);
  wrt << ')';
}